

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void plot_masked_sprite_16px_left(tgestate_t *state,uint8_t x)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  long lVar12;
  byte bVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  ulong uVar17;
  byte *pbVar18;
  byte bVar19;
  
  bVar11 = x - 4;
  puVar2 = state->bitmap_pointer;
  puVar3 = state->mask_pointer;
  uVar1 = (state->spriteplotter).height_16_right;
  lVar12 = 0;
  do {
    bVar16 = puVar2[lVar12 * 2];
    bVar13 = puVar2[lVar12 * 2 + 1];
    bVar6 = puVar3[lVar12 * 2];
    bVar7 = puVar3[lVar12 * 2 + 1];
    if ((char)state->sprite_index < '\0') {
      uVar17 = (ulong)bVar16;
      uVar14 = (ulong)bVar6;
      bVar6 = state->reversed[bVar7];
      bVar7 = state->reversed[uVar14];
      bVar16 = state->reversed[bVar13];
      bVar13 = state->reversed[uVar17];
    }
    if (x == '\x04') {
      bVar10 = bVar7 * '\x02' + 1;
      bVar19 = bVar6 >> 7;
      bVar6 = bVar6 * '\x02' | bVar7 >> 7;
      bVar19 = bVar19 | 0xfe;
LAB_0010b7f6:
      bVar7 = bVar10 * '\x02' + 1;
      bVar10 = bVar6 * '\x02' | bVar10 >> 7;
      bVar19 = bVar19 * '\x02' | bVar6 >> 7;
      bVar5 = true;
LAB_0010b81a:
      if (x == '\x04') {
        bVar6 = bVar13 * '\x02';
        bVar8 = bVar16 >> 7;
        bVar16 = bVar16 * '\x02' | bVar13 >> 7;
      }
      else {
        bVar8 = 0;
        bVar6 = bVar13;
      }
      bVar15 = bVar16;
      bVar13 = bVar6;
      if (bVar5) {
        bVar13 = bVar6 * '\x02';
        bVar15 = bVar16 * '\x02' | bVar6 >> 7;
        bVar8 = bVar8 * '\x02' | bVar16 >> 7;
      }
      bVar19 = (byte)(bVar10 * '\x02') >> 7 | bVar10 >> 6 & 2 | bVar19 << 2;
      bVar9 = bVar8 * '\x02' | bVar15 >> 7;
      bVar8 = bVar15 * '\x02' | bVar13 >> 7;
      bVar16 = bVar13 * '\x02';
      bVar6 = bVar7 >> 6 & 1 | (bVar7 >> 7 | bVar10 * '\x02') * '\x02';
      bVar7 = bVar7 * '\x04' | 3;
LAB_0010b8ba:
      bVar13 = bVar16 * '\x02';
      bVar16 = bVar8 * '\x02' | bVar16 >> 7;
      bVar10 = bVar9 * '\x02' | bVar8 >> 7;
    }
    else {
      bVar19 = 0xff;
      bVar10 = bVar7;
      if (bVar11 == 1) goto LAB_0010b7f6;
      if (bVar11 < 3) {
        bVar5 = false;
        bVar10 = bVar6;
        goto LAB_0010b81a;
      }
      if (bVar11 == 3) {
        bVar19 = bVar6 >> 7 | 0xfe;
        bVar9 = 0;
        bVar8 = bVar16;
        bVar16 = bVar13;
        bVar6 = bVar6 * '\x02' | bVar7 >> 7;
        bVar7 = bVar7 * '\x02' + 1;
        goto LAB_0010b8ba;
      }
      bVar19 = 0xff;
      bVar10 = 0;
    }
    pbVar4 = state->foreground_mask_pointer;
    pbVar18 = state->window_buf_pointer;
    if ((state->spriteplotter).enable_16_right_1 != '\0') {
      *pbVar18 = bVar10 & *pbVar4 | (bVar19 | ~*pbVar4) & *pbVar18;
    }
    if ((state->spriteplotter).enable_16_right_2 != '\0') {
      pbVar18[1] = bVar16 & pbVar4[1] | (bVar6 | ~pbVar4[1]) & pbVar18[1];
    }
    pbVar18 = pbVar18 + 2;
    if ((state->spriteplotter).enable_16_right_3 != '\0') {
      *pbVar18 = bVar13 & pbVar4[2] | (bVar7 | ~pbVar4[2]) & *pbVar18;
    }
    state->foreground_mask_pointer = pbVar4 + 4;
    state->window_buf_pointer = pbVar18 + (long)state->columns + -2;
    lVar12 = lVar12 + 1;
    if (uVar1 == (uint8_t)lVar12) {
      return;
    }
  } while( true );
}

Assistant:

void plot_masked_sprite_16px_left(tgestate_t *state, uint8_t x)
{
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  assert(x >= 4 && x < 8);

  ASSERT_MASK_BUF_PTR_VALID(state->foreground_mask_pointer);

  x -= 4; /* jump table offset (on input, x is 4..7) */

  maskptr   = state->mask_pointer;
  bitmapptr = state->bitmap_pointer;

  assert(maskptr   != NULL);
  assert(bitmapptr != NULL);

  iters = state->spriteplotter.height_16_right; /* self modified by $E49D (setup_vischar_plotting) */
  assert(iters <= MASK_BUFFER_HEIGHT * 8);

  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer, 2);
  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer + (iters - 1) * state->columns + 2 - 1, 2);
  do
  {
    /* Note the different variable order to the right shifting case above. */
    uint8_t bm0, bm1, bm2;       /* was E, D, C */
    uint8_t mask0, mask1, mask2; /* was E', D', C' */
    int     carry = 0;

    /* Load bitmap bytes into D,E. */
    bm1 = *bitmapptr++;
    bm0 = *bitmapptr++;

    /* Load mask bytes into D',E'. */
    mask1 = *maskptr++;
    mask0 = *maskptr++;

    if (state->sprite_index & sprite_FLAG_FLIP)
      flip_16_masked_pixels(state, &mask1, &mask0, &bm1, &bm0);

    foremaskptr = state->foreground_mask_pointer;
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Shift mask bytes */

    mask2 = 0xFF; /* all bits set => mask off */
    carry = 1; /* mask off */
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }
    if (x <= 1)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }
    if (x <= 2)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }
    if (x <= 3)
    {
      RL(mask0);
      RL(mask1);
      RL(mask2);
    }

    /* Shift bitmap bytes */

    bm2 = 0; /* all bits clear => pixels off */
    // no carry reset in this variant?
    /* Conv: Replaced self-modified goto with if-else chain. */
    if (x <= 0)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }
    if (x <= 1)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }
    if (x <= 2)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }
    if (x <= 3)
    {
      SLA(bm0);
      RL(bm1);
      RL(bm2);
    }

    /* Plot, using foreground mask. */

    screenptr = state->window_buf_pointer; // line moved relative to the 24 version
    ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    ASSERT_MASK_BUF_PTR_VALID(foremaskptr);

    /* Conv: We form 'mask' inside of the enable_* condition. The original
     * game got away with accessing out-of-bounds memory but we can't. */

    if (state->spriteplotter.enable_16_right_1)
      *screenptr = MASK(bm2, mask2);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_right_2)
      *screenptr = MASK(bm1, mask1);
    foremaskptr++;
    screenptr++;

    if (state->spriteplotter.enable_16_right_3)
      *screenptr = MASK(bm0, mask0);
    foremaskptr += 2;
    state->foreground_mask_pointer = foremaskptr;

    screenptr += state->columns - 2; /* was 22 */
    if (iters > 1)
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 2);
    state->window_buf_pointer = screenptr;
  }
  while (--iters);
}